

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::
write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<long_long,duckdb_fmt::v6::basic_format_specs<char>>::dec_writer>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>> *this,int num_digits,string_view prefix,
          format_specs specs,dec_writer f)

{
  ulong uVar1;
  uint uVar2;
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<long_long,_duckdb_fmt::v6::basic_format_specs<char>_>::dec_writer>
  local_60;
  
  local_60.f.abs_value = f.abs_value;
  local_60.prefix.size_ = prefix.size_;
  local_60.prefix.data_ = prefix.data_;
  local_60.size_ = (uint)num_digits + local_60.prefix.size_;
  local_60.fill = specs.fill.data_[0];
  if ((specs._9_1_ & 0xf) == 4) {
    uVar1 = (ulong)(uint)specs.width;
    local_60.padding = 0;
    if (local_60.size_ <= uVar1) {
      local_60.padding = uVar1 - local_60.size_;
      local_60.size_ = uVar1;
    }
  }
  else {
    local_60.padding = 0;
    uVar2 = specs.precision - num_digits;
    local_60.fill = '0';
    if (uVar2 == 0 || specs.precision < num_digits) {
      local_60.fill = specs.fill.data_[0];
    }
    if (uVar2 != 0 && num_digits <= specs.precision) {
      local_60.size_ = (uint)specs.precision + local_60.prefix.size_;
      local_60.padding = (ulong)uVar2;
    }
    if (((undefined1  [20])specs & (undefined1  [20])0xf00) == (undefined1  [20])0x0) {
      specs._9_1_ = specs._9_1_ | 2;
    }
  }
  local_60.f.num_digits = f.num_digits;
  write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<long_long,duckdb_fmt::v6::basic_format_specs<char>>::dec_writer>>
            (this,&specs,&local_60);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }